

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Auxiliary * fts5FindAuxiliary(Fts5FullTable *pTab,char *zName)

{
  Fts5Global *pFVar1;
  _func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_tokenizer_ptr__func_void_void_ptr_ptr *zRight;
  int iVar2;
  
  pFVar1 = pTab->pGlobal;
  do {
    if (pFVar1 == (Fts5Global *)0x0) {
      return (Fts5Auxiliary *)0x0;
    }
    zRight = (pFVar1->api).xCreateTokenizer;
    if (zName == (char *)0x0) {
      iVar2 = -(uint)(zRight !=
                     (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_tokenizer_ptr__func_void_void_ptr_ptr
                      *)0x0);
LAB_001a98b5:
      if (iVar2 == 0) {
        return (Fts5Auxiliary *)pFVar1;
      }
    }
    else if (zRight != (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_tokenizer_ptr__func_void_void_ptr_ptr
                        *)0x0) {
      iVar2 = sqlite3StrICmp(zName,(char *)zRight);
      goto LAB_001a98b5;
    }
    pFVar1 = (Fts5Global *)pFVar1->iNextId;
  } while( true );
}

Assistant:

static Fts5Auxiliary *fts5FindAuxiliary(Fts5FullTable *pTab, const char *zName){
  Fts5Auxiliary *pAux;

  for(pAux=pTab->pGlobal->pAux; pAux; pAux=pAux->pNext){
    if( sqlite3_stricmp(zName, pAux->zFunc)==0 ) return pAux;
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}